

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O2

InstructionAtom * __thiscall Instruction::get_imm_src(Instruction *this)

{
  InstructionAtom *pIVar1;
  InstructionAtom *pIVar2;
  long lVar3;
  InstructionAtom *pIVar4;
  
  lVar3 = (ulong)this->n_src + 1;
  pIVar4 = (InstructionAtom *)&this[-1].dst[0].sym;
  do {
    lVar3 = lVar3 + -1;
    if (lVar3 == 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/Instruction.cpp"
                    ,0xf1,"InstructionAtom &Instruction::get_imm_src()");
    }
    pIVar1 = pIVar4 + 1;
    pIVar2 = pIVar4 + 1;
    pIVar4 = pIVar1;
  } while (pIVar2->kind != IMM);
  return pIVar1;
}

Assistant:

InstructionAtom& Instruction::get_imm_src() {
  for (int i = 0; i < n_src; i++) {
    if (src[i].kind == InstructionAtom::IMM) {
      return src[i];
    }
  }
  assert(false);
  return src[0];
}